

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CluDetectSpecialCaseCofs(word *pF,int nVars,int iVar)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  word *pwVar11;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_38;
  int local_34;
  
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                  ,0x41b,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
  }
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_48._4_4_ = 0;
  uStack_50._0_4_ = 0;
  uStack_50._4_4_ = 0;
  if (iVar < 6) {
    iVar5 = (int)local_58;
    if (0 < (int)uVar1) {
      uVar7 = ~Truth6[iVar];
      local_5c = 0;
      uVar9 = 0;
      do {
        uVar4 = (Truth6[iVar] & pF[uVar9]) >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f);
        uVar10 = pF[uVar9] & uVar7;
        if (uVar10 == 0) {
          iVar5 = iVar5 + 1;
        }
        else if (uVar10 == uVar7) {
          local_58._4_4_ = local_58._4_4_ + 1;
        }
        else if (uVar4 == 0) {
          uStack_50._0_4_ = (int)uStack_50 + 1;
        }
        else if (uVar4 == uVar7) {
          uStack_50._4_4_ = uStack_50._4_4_ + 1;
        }
        else if ((uVar4 ^ uVar10) == 0xffffffffffffffff) {
          local_5c = local_5c + 1;
        }
        else {
          local_48._4_4_ = local_48._4_4_ + (uVar10 == uVar4);
        }
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
      local_48 = CONCAT44(local_48._4_4_,local_5c);
      local_58 = (ulong)local_58._4_4_ << 0x20;
    }
    local_58 = CONCAT44(local_58._4_4_,iVar5);
  }
  else {
    iVar5 = (int)local_58;
    if (0 < (int)uVar1) {
      bVar3 = (byte)(iVar + -6);
      uVar6 = 1 << (bVar3 & 0x1f);
      local_34 = 2 << (bVar3 & 0x1f);
      uVar7 = 1;
      if (1 < (int)uVar6) {
        uVar7 = (ulong)uVar6;
      }
      local_38 = 0;
      pwVar11 = pF + (int)uVar6;
      iVar8 = 0;
      do {
        if (iVar + -6 != 0x1f) {
          uVar9 = 0;
          do {
            uVar4 = pF[uVar9];
            if (uVar4 == 0xffffffffffffffff) {
              local_58._4_4_ = local_58._4_4_ + 1;
            }
            else if (uVar4 == 0) {
              iVar5 = iVar5 + 1;
            }
            else {
              uVar10 = pwVar11[uVar9];
              if (uVar10 == 0xffffffffffffffff) {
                uStack_50._4_4_ = uStack_50._4_4_ + 1;
              }
              else if (uVar10 == 0) {
                uStack_50._0_4_ = (int)uStack_50 + 1;
              }
              else if ((uVar10 ^ uVar4) == 0xffffffffffffffff) {
                local_38 = local_38 + 1;
              }
              else {
                local_48._4_4_ = local_48._4_4_ + (uVar4 == uVar10);
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
        iVar8 = iVar8 + local_34;
        pwVar11 = pwVar11 + local_34;
        pF = pF + local_34;
      } while (iVar8 < (int)uVar1);
      local_58 = (ulong)local_58._4_4_ << 0x20;
      local_48 = CONCAT44(local_48._4_4_,local_38);
    }
    local_58 = CONCAT44(local_58._4_4_,iVar5);
    uVar1 = (int)uVar1 / 2;
  }
  if (local_48._4_4_ == uVar1) {
    __assert_fail("State[5] != nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                  ,0x44d,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
  }
  lVar2 = 0;
  do {
    uVar6 = *(uint *)((long)&local_58 + lVar2 * 4);
    if (uVar6 != uVar1 && (int)uVar1 <= (int)uVar6) {
      __assert_fail("State[i] <= nWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                    ,0x450,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
    }
    if (uVar6 == uVar1) goto LAB_003edb8c;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  lVar2 = 0xffffffff;
LAB_003edb8c:
  return (int)lVar2;
}

Assistant:

int If_CluDetectSpecialCaseCofs( word * pF, int nVars, int iVar )
{
    word Cof0, Cof1;
    int State[6] = {0};
    int i, nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
        {
            Cof0 =  (pF[i] & ~Truth6[iVar]);
            Cof1 = ((pF[i] &  Truth6[iVar]) >> Shift);

            if ( Cof0 == 0 )
                State[0]++;
            else if ( Cof0 == ~Truth6[iVar] )
                State[1]++;
            else if ( Cof1 == 0 )
                State[2]++;
            else if ( Cof1 == ~Truth6[iVar] )
                State[3]++;
            else if ( Cof0 == ~Cof1 )
                State[4]++;
            else if ( Cof0 == Cof1 )
                State[5]++;
        }
    }
    else
    {
        int k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                Cof0 = pF[i];
                Cof1 = pF[Step+i];

                if ( Cof0 == 0 )
                    State[0]++;
                else if ( Cof0 == ~(word)0 )
                    State[1]++;
                else if ( Cof1 == 0 )
                    State[2]++;
                else if ( Cof1 == ~(word)0 )
                    State[3]++;
                else if ( Cof0 == ~Cof1 )
                    State[4]++;
                else if ( Cof0 == Cof1 )
                    State[5]++;
            }
            pF    += 2*Step;
        }
        nWords /= 2;
    }
    assert( State[5] != nWords );
    for ( i = 0; i < 5; i++ )
    {
        assert( State[i] <= nWords );
        if ( State[i] == nWords )
            return i;
    }
    return -1;
}